

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O0

function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
* __thiscall
chaiscript::dispatch::functor<std::__cxx11::string(chaiscript::Boxed_Value_const&)>
          (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
           *__return_storage_ptr__,dispatch *this,Const_Proxy_Function *func,
          Type_Conversions_State *t_conversions)

{
  initializer_list<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> __l;
  Type_Conversions_State *t_conversions_00;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *local_98;
  undefined1 local_59 [17];
  iterator local_48;
  size_type local_40;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_38;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *local_20;
  Type_Conversions_State *t_conversions_local;
  Const_Proxy_Function *func_local;
  
  local_20 = (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
              *)func;
  t_conversions_local = (Type_Conversions_State *)this;
  func_local = (Const_Proxy_Function *)__return_storage_ptr__;
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)((long)local_59 + 1U),
             (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)this);
  local_40 = 1;
  t_conversions_00 = (Type_Conversions_State *)local_59;
  local_48 = (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)((long)local_59 + 1U);
  std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::allocator
            ((allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> *)
             t_conversions_00);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector(&local_38,__l,(allocator_type *)t_conversions_00);
  functor<std::__cxx11::string(chaiscript::Boxed_Value_const&)>
            (__return_storage_ptr__,(dispatch *)&local_38,local_20,t_conversions_00);
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_38);
  std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::~allocator
            ((allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> *)
             local_59);
  local_98 = (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)&local_48;
  do {
    local_98 = local_98 + -1;
    std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_98);
  } while (local_98 !=
           (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)((long)local_59 + 1U));
  return __return_storage_ptr__;
}

Assistant:

std::function<FunctionType> functor(Const_Proxy_Function func, const Type_Conversions_State *t_conversions) {
      return functor<FunctionType>(std::vector<Const_Proxy_Function>({std::move(func)}), t_conversions);
    }